

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

_Bool golf_level_get_camera_zone
                (golf_level_t *level,vec3 pos,golf_camera_zone_entity_t *camera_zone)

{
  uint uVar1;
  golf_entity_t *pgVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = (level->entities).length;
  uVar8 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  lVar9 = 0x78;
  do {
    if (uVar10 == uVar8) {
LAB_0012d63d:
      return (long)uVar8 < (long)(int)uVar1;
    }
    pgVar2 = (level->entities).data;
    if (*(int *)(pgVar2->name + lVar9 + -0x7c) == 7) {
      if ((pos.x < *(float *)(pgVar2->name + lVar9 + -0x30) +
                   *(float *)(pgVar2->name + lVar9 + -0x14)) &&
         (*(float *)(pgVar2->name + lVar9 + -0x30) - *(float *)(pgVar2->name + lVar9 + -0x14) <
          pos.x)) {
        if ((pos.z < *(float *)(pgVar2->name + lVar9 + -0x28) +
                     *(float *)(pgVar2->name + lVar9 + -0xc)) &&
           (*(float *)(pgVar2->name + lVar9 + -0x28) - *(float *)(pgVar2->name + lVar9 + -0xc) <
            pos.z)) {
          uVar3 = *(undefined8 *)(pgVar2->name + lVar9 + -0x34);
          uVar4 = *(undefined8 *)(pgVar2->name + lVar9 + -0x34 + 8);
          uVar5 = *(undefined8 *)(pgVar2->name + lVar9 + -0x24);
          uVar6 = *(undefined8 *)(pgVar2->name + lVar9 + -0x24 + 8);
          uVar7 = *(undefined8 *)(pgVar2->name + lVar9 + -0x18 + 8);
          *(undefined8 *)&(camera_zone->transform).rotation.w =
               *(undefined8 *)(pgVar2->name + lVar9 + -0x18);
          (camera_zone->transform).scale.y = (float)(int)uVar7;
          (camera_zone->transform).scale.z = (float)(int)((ulong)uVar7 >> 0x20);
          (camera_zone->transform).rotation.x = (float)(int)uVar5;
          (camera_zone->transform).rotation.y = (float)(int)((ulong)uVar5 >> 0x20);
          (camera_zone->transform).rotation.z = (float)(int)uVar6;
          (camera_zone->transform).rotation.w = (float)(int)((ulong)uVar6 >> 0x20);
          camera_zone->towards_hole = (_Bool)(char)uVar3;
          *(int3 *)&camera_zone->field_0x1 = (int3)((ulong)uVar3 >> 8);
          (camera_zone->transform).position.x = (float)(int)((ulong)uVar3 >> 0x20);
          (camera_zone->transform).position.y = (float)(int)uVar4;
          (camera_zone->transform).position.z = (float)(int)((ulong)uVar4 >> 0x20);
          goto LAB_0012d63d;
        }
      }
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x510;
  } while( true );
}

Assistant:

bool golf_level_get_camera_zone(golf_level_t *level, vec3 pos, golf_camera_zone_entity_t *camera_zone) {
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (entity->type != CAMERA_ZONE_ENTITY) {
            continue;
        }

        vec3 cz_pos = entity->camera_zone.transform.position;
        vec3 cz_scale = entity->camera_zone.transform.scale;
        if (pos.x < cz_pos.x + cz_scale.x && pos.x > cz_pos.x - cz_scale.x &&
                pos.z < cz_pos.z + cz_scale.z && pos.z > cz_pos.z - cz_scale.z) {
            *camera_zone = entity->camera_zone;
            return true;
        }
    }
    return false;
}